

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * finalizepsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff528;
  vector<RPCResult,_std::allocator<RPCResult>_> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  UniValue *in_stack_fffffffffffff530;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff558;
  string *in_stack_fffffffffffff560;
  UniValue *in_stack_fffffffffffff568;
  char *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff578;
  undefined1 in_stack_fffffffffffff57f;
  string *in_stack_fffffffffffff580;
  string *in_stack_fffffffffffff588;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff590;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff598;
  RPCArg *in_stack_fffffffffffff5a0;
  pointer *ppRVar3;
  RPCResult *in_stack_fffffffffffff5a8;
  RPCResult *in_stack_fffffffffffff5b0;
  RPCExamples *examples;
  RPCHelpMan *args;
  string *description;
  undefined7 in_stack_fffffffffffff690;
  undefined1 uVar4;
  RPCHelpMan *this_02;
  allocator<char> local_8eb;
  allocator<char> local_8ea [2];
  pointer local_8e8;
  pointer pRStack_8e0;
  pointer local_8d8;
  allocator<char> local_8ca;
  allocator<char> local_8c9 [31];
  allocator<char> local_8aa;
  allocator<char> local_8a9 [31];
  allocator<char> local_88a;
  allocator<char> local_889 [25];
  _Alloc_hider in_stack_fffffffffffff790;
  allocator<char> local_84c;
  undefined1 local_84b;
  allocator<char> local_84a;
  allocator<char> local_849;
  undefined4 local_848;
  allocator<char> local_841 [31];
  RPCExamples local_822 [10];
  undefined1 local_6e0 [272];
  RPCHelpMan local_5d0;
  undefined1 local_480;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  description = (string *)((long)&local_822[0].m_examples._M_dataplus._M_p + 1);
  args = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  examples = local_822;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_848 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff538,&in_stack_fffffffffffff530->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff540);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff528);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                 (Type)((ulong)in_stack_fffffffffffff590 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_84b = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff568,(bool *)in_stack_fffffffffffff560);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff538,in_stack_fffffffffffff530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_480 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff540);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff528);
  local_440 = 0;
  local_43f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                 (Type)((ulong)in_stack_fffffffffffff590 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff528);
  __l._M_len._0_7_ = in_stack_fffffffffffff578;
  __l._M_array = (iterator)in_stack_fffffffffffff570;
  __l._M_len._7_1_ = in_stack_fffffffffffff57f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff568,__l,
             (allocator_type *)in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_8a9[1] = (allocator<char>)0x0;
  local_8a9[2] = (allocator<char>)0x0;
  local_8a9[3] = (allocator<char>)0x0;
  local_8a9[4] = (allocator<char>)0x0;
  local_8a9[5] = (allocator<char>)0x0;
  local_8a9[6] = (allocator<char>)0x0;
  local_8a9[7] = (allocator<char>)0x0;
  local_8a9[8] = (allocator<char>)0x0;
  local_8a9[9] = (allocator<char>)0x0;
  local_8a9[10] = (allocator<char>)0x0;
  local_8a9[0xb] = (allocator<char>)0x0;
  local_8a9[0xc] = (allocator<char>)0x0;
  local_8a9[0xd] = (allocator<char>)0x0;
  local_8a9[0xe] = (allocator<char>)0x0;
  local_8a9[0xf] = (allocator<char>)0x0;
  local_8a9[0x10] = (allocator<char>)0x0;
  local_8a9[0x11] = (allocator<char>)0x0;
  local_8a9[0x12] = (allocator<char>)0x0;
  local_8a9[0x13] = (allocator<char>)0x0;
  local_8a9[0x14] = (allocator<char>)0x0;
  local_8a9[0x15] = (allocator<char>)0x0;
  local_8a9[0x16] = (allocator<char>)0x0;
  local_8a9[0x17] = (allocator<char>)0x0;
  local_8a9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff528);
  this = (vector<RPCResult,_std::allocator<RPCResult>_> *)
         ((ulong)in_stack_fffffffffffff528 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff5a8,(Type)((ulong)in_stack_fffffffffffff5a0 >> 0x20),
             in_stack_fffffffffffff598,SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0),
             in_stack_fffffffffffff588,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff580,
             (bool)in_stack_fffffffffffff57f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_8c9[1] = (allocator<char>)0x0;
  local_8c9[2] = (allocator<char>)0x0;
  local_8c9[3] = (allocator<char>)0x0;
  local_8c9[4] = (allocator<char>)0x0;
  local_8c9[5] = (allocator<char>)0x0;
  local_8c9[6] = (allocator<char>)0x0;
  local_8c9[7] = (allocator<char>)0x0;
  local_8c9[8] = (allocator<char>)0x0;
  local_8c9[9] = (allocator<char>)0x0;
  local_8c9[10] = (allocator<char>)0x0;
  local_8c9[0xb] = (allocator<char>)0x0;
  local_8c9[0xc] = (allocator<char>)0x0;
  local_8c9[0xd] = (allocator<char>)0x0;
  local_8c9[0xe] = (allocator<char>)0x0;
  local_8c9[0xf] = (allocator<char>)0x0;
  local_8c9[0x10] = (allocator<char>)0x0;
  local_8c9[0x11] = (allocator<char>)0x0;
  local_8c9[0x12] = (allocator<char>)0x0;
  local_8c9[0x13] = (allocator<char>)0x0;
  local_8c9[0x14] = (allocator<char>)0x0;
  local_8c9[0x15] = (allocator<char>)0x0;
  local_8c9[0x16] = (allocator<char>)0x0;
  local_8c9[0x17] = (allocator<char>)0x0;
  local_8c9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff5a8,(Type)((ulong)in_stack_fffffffffffff5a0 >> 0x20),
             in_stack_fffffffffffff598,SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0),
             in_stack_fffffffffffff588,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff580,
             (bool)in_stack_fffffffffffff57f);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff588 >> 0x38);
  this_02 = &local_5d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  local_8e8 = (pointer)0x0;
  pRStack_8e0 = (pointer)0x0;
  local_8d8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_fffffffffffff5b0,(Type)((ulong)in_stack_fffffffffffff5a8 >> 0x20),
             &in_stack_fffffffffffff5a0->m_names,in_stack_fffffffffffff598,in_stack_fffffffffffff590
             ,(bool)skip_type_check);
  uVar4 = 0;
  std::allocator<RPCResult>::allocator(this_00);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff578;
  __l_00._M_array = (iterator)in_stack_fffffffffffff570;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff57f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff568,__l_00,
             (allocator_type *)in_stack_fffffffffffff560);
  RPCResult::RPCResult
            (in_stack_fffffffffffff5b0,(Type)((ulong)in_stack_fffffffffffff5a8 >> 0x20),
             &in_stack_fffffffffffff5a0->m_names,in_stack_fffffffffffff598,in_stack_fffffffffffff590
             ,(bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff5a8,(RPCResult *)in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),in_stack_fffffffffffff570
             ,(allocator<char> *)in_stack_fffffffffffff568);
  HelpExampleCli(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x6a761c);
  this_01 = (RPCArg *)&stack0xfffffffffffff6f0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<finalizepsbt()::__0,void>
            (in_stack_fffffffffffff538,(anon_class_1_0_00000001 *)in_stack_fffffffffffff530);
  RPCHelpMan::RPCHelpMan
            (this_02,(string *)CONCAT17(uVar4,in_stack_fffffffffffff690),description,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)args,(RPCResults *)in_RDI,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff790._M_p);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_8eb);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_8ea);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff538);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  puVar2 = local_6e0;
  ppRVar3 = (pointer *)
            ((long)&local_5d0.m_results.m_results.
                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  do {
    ppRVar3 = ppRVar3 + -0x11;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (ppRVar3 != (pointer *)puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff538);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_8ca);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_8c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff538);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_8aa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_8a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff538);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_88a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_889);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff796);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff797);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff538);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_84c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_84a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_849);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_841);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_822);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&local_822[0].m_examples._M_dataplus._M_p + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return args;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan finalizepsbt()
{
    return RPCHelpMan{"finalizepsbt",
                "Finalize the inputs of a PSBT. If the transaction is fully signed, it will produce a\n"
                "network serialized transaction which can be broadcast with sendrawtransaction. Otherwise a PSBT will be\n"
                "created which has the final_scriptSig and final_scriptWitness fields filled for inputs that are complete.\n"
                "Implements the Finalizer and Extractor roles.\n",
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"},
                    {"extract", RPCArg::Type::BOOL, RPCArg::Default{true}, "If true and the transaction is complete,\n"
            "                             extract and return the complete transaction in normal network serialization instead of the PSBT."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "psbt", /*optional=*/true, "The base64-encoded partially signed transaction if not extracted"},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The hex-encoded network transaction if extracted"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("finalizepsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    bool extract = request.params[1].isNull() || (!request.params[1].isNull() && request.params[1].get_bool());

    CMutableTransaction mtx;
    bool complete = FinalizeAndExtractPSBT(psbtx, mtx);

    UniValue result(UniValue::VOBJ);
    DataStream ssTx{};
    std::string result_str;

    if (complete && extract) {
        ssTx << TX_WITH_WITNESS(mtx);
        result_str = HexStr(ssTx);
        result.pushKV("hex", result_str);
    } else {
        ssTx << psbtx;
        result_str = EncodeBase64(ssTx.str());
        result.pushKV("psbt", result_str);
    }
    result.pushKV("complete", complete);

    return result;
},
    };
}